

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeSIMDShuffle
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,
          array<unsigned_char,_16UL> *lanes)

{
  SIMDShuffle *pSVar1;
  bool bVar2;
  Ok local_b5;
  uint local_b4;
  Err local_b0;
  Err *local_80;
  Err *err;
  Result<wasm::Ok> _val;
  SIMDShuffle curr;
  array<unsigned_char,_16UL> *lanes_local;
  IRBuilder *this_local;
  
  pSVar1 = (SIMDShuffle *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  SIMDShuffle::SIMDShuffle(pSVar1);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitSIMDShuffle
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pSVar1);
  local_80 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_80 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_b0,local_80);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  local_b4 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_b4 == 0) {
    pSVar1 = Builder::makeSIMDShuffle
                       (&this->builder,
                        (Expression *)
                        curr.super_SpecificExpression<(wasm::Expression::Id)31>.super_Expression.
                        type.id,curr.left,lanes);
    push(this,(Expression *)pSVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_b5);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeSIMDShuffle(const std::array<uint8_t, 16>& lanes) {
  SIMDShuffle curr;
  CHECK_ERR(visitSIMDShuffle(&curr));
  push(builder.makeSIMDShuffle(curr.left, curr.right, lanes));
  return Ok{};
}